

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

void __thiscall DecHeap::trickle_down(DecHeap *this,size_t idx)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  size_type local_20;
  size_t min_idx;
  size_t idx_local;
  DecHeap *this_local;
  
  min_idx = idx;
  while( true ) {
    sVar2 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(&this->heap);
    if (sVar2 <= min_idx * 2 + 1) {
      return;
    }
    local_20 = min_idx * 2 + 1;
    sVar2 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(&this->heap);
    if (min_idx * 2 + 2 < sVar2) {
      pvVar3 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->heap,min_idx * 2 + 2);
      uVar1 = pvVar3->first;
      pvVar3 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->heap,min_idx * 2 + 1);
      if (uVar1 < pvVar3->first) {
        local_20 = min_idx * 2 + 2;
      }
    }
    pvVar3 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->heap,local_20);
    uVar1 = pvVar3->first;
    pvVar3 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->heap,min_idx);
    if (pvVar3->first <= uVar1) break;
    swap(this,min_idx,local_20);
    min_idx = local_20;
  }
  return;
}

Assistant:

void DecHeap::trickle_down(size_t idx) {
    while ((idx * 2 + 1) < heap.size()) {
        auto min_idx = idx * 2 + 1;
        if ((idx * 2 + 2) < heap.size() && heap[idx * 2 + 2].first < heap[idx * 2 + 1].first) {
            min_idx += 1;
        }
        if (heap[min_idx].first < heap[idx].first) {
            this->swap(idx, min_idx);
            idx = min_idx;
        } else {
            break;
        }
    }
}